

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O1

JsErrorCode
JsDiagStartDebugging
          (JsRuntimeHandle runtimeHandle,JsDiagDebugEventCallback debugEventCallback,
          void *callbackState)

{
  DWORD *pDVar1;
  ThreadContext *threadContext;
  ProbeContainer *this;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  HRESULT hr;
  JsrtDebugManager *pJVar5;
  undefined4 *puVar6;
  DebugContext *this_00;
  JsErrorCode JVar7;
  JsrtRuntime *runtime;
  ScriptContext *this_01;
  AutoNestedHandledExceptionType local_78 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_78,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar7 = JsErrorInvalidArgument;
  }
  else if (debugEventCallback == (JsDiagDebugEventCallback)0x0) {
    JVar7 = JsErrorNullArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    threadContext = *runtimeHandle;
    if (threadContext->recycler != (Recycler *)0x0) {
      bVar3 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler);
      JVar7 = JsErrorHeapEnumInProgress;
      if (bVar3) goto LAB_003b4225;
    }
    JVar7 = JsErrorInThreadServiceCallback;
    if (((threadContext->threadService).isInCallback == false) &&
       (JVar7 = JsErrorRuntimeInUse, threadContext->callRootLevel == 0)) {
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage,threadContext);
      JVar7 = JsErrorWrongThread;
      if (anon_var_0.m_staticAbortMessage._1_1_ != '\0') {
        pJVar5 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
        if (pJVar5 != (JsrtDebugManager *)0x0) {
          pJVar5 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
          bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(pJVar5);
          JVar7 = JsErrorDiagAlreadyInDebugMode;
          if (bVar3) goto LAB_003b42e2;
        }
        JsrtRuntime::EnsureJsrtDebugManager((JsrtRuntime *)runtimeHandle);
        pJVar5 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
        JsrtDebugManager::SetDebugEventCallback(pJVar5,debugEventCallback,callbackState);
        if (threadContext->debugManager != (DebugManager *)0x0) {
          pDVar1 = &threadContext->debugManager->localsDisplayFlags;
          *(byte *)pDVar1 = (byte)*pDVar1 | 1;
        }
        this_01 = *(ScriptContext **)(*runtimeHandle + 0x10e0);
        JVar7 = JsNoError;
        if (this_01 != (ScriptContext *)0x0) {
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          do {
            iVar4 = (*(this_01->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_01);
            JVar7 = JsNoError;
            if ((char)iVar4 != '\0') break;
            bVar3 = Js::ScriptContext::IsScriptContextInDebugMode(this_01);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDiag.cpp"
                                 ,0x56,"(!scriptContext->IsScriptContextInDebugMode())",
                                 "!scriptContext->IsScriptContextInDebugMode()");
              if (!bVar3) goto LAB_003b4421;
              *puVar6 = 0;
            }
            this_00 = Js::ScriptContext::GetDebugContext(this_01);
            if (this_00->hostDebugContext == (HostDebugContext *)0x0) {
              Js::DebugContext::SetHostDebugContext(this_00,&pJVar5->super_HostDebugContext);
            }
            hr = Js::ScriptContext::OnDebuggerAttached(this_01);
            if (hr < 0) {
              Debugger_AttachDetach_unrecoverable_error(hr);
            }
            else {
              iVar4 = (*(this_01->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_01);
              if ((char)iVar4 == '\0') {
                this = this_00->diagProbesContainer;
                Js::ProbeContainer::InitializeInlineBreakEngine(this,&pJVar5->super_HaltCallback);
                Js::ProbeContainer::InitializeDebuggerScriptOptionCallback
                          (this,&pJVar5->super_DebuggerOptionsCallback);
              }
            }
            if (hr < 0) {
              JVar7 = JsErrorFatal;
              break;
            }
            this_01 = this_01->next;
          } while (this_01 != (ScriptContext *)0x0);
        }
      }
LAB_003b42e2:
      ThreadContextScope::~ThreadContextScope
                ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage);
    }
  }
LAB_003b4225:
  if (JVar7 < JsErrorOutOfMemory) {
    if ((6 < JVar7 - JsErrorNoCurrentContext) ||
       ((0x43U >> (JVar7 - JsErrorNoCurrentContext & 0x1f) & 1) == 0)) goto LAB_003b42c3;
  }
  else if (JVar7 < JsErrorScriptTerminated) {
    if ((JVar7 != JsErrorOutOfMemory) && (JVar7 != JsErrorScriptException)) goto LAB_003b42c3;
  }
  else if ((JVar7 != JsErrorFatal) && (JVar7 != JsErrorScriptTerminated)) goto LAB_003b42c3;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                     ,0x89,
                     "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                     ,
                     "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                    );
  if (!bVar3) {
LAB_003b4421:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar6 = 0;
LAB_003b42c3:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_78);
  return JVar7;
}

Assistant:

CHAKRA_API JsDiagStartDebugging(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsDiagDebugEventCallback debugEventCallback,
    _In_opt_ void* callbackState)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        PARAM_NOT_NULL(debugEventCallback);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();

        VALIDATE_RUNTIME_STATE_FOR_START_STOP_DEBUGGING(threadContext);

        if (runtime->GetJsrtDebugManager() != nullptr && runtime->GetJsrtDebugManager()->IsDebugEventCallbackSet())
        {
            return JsErrorDiagAlreadyInDebugMode;
        }

        // Create the debug object to save callback function and data
        runtime->EnsureJsrtDebugManager();

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        jsrtDebugManager->SetDebugEventCallback(debugEventCallback, callbackState);

        if (threadContext->GetDebugManager() != nullptr)
        {
            threadContext->GetDebugManager()->SetLocalsDisplayFlags(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods);
        }

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            Assert(!scriptContext->IsScriptContextInDebugMode());

            Js::DebugContext* debugContext = scriptContext->GetDebugContext();

            if (debugContext->GetHostDebugContext() == nullptr)
            {
                debugContext->SetHostDebugContext(jsrtDebugManager);
            }

            HRESULT hr;
            if (FAILED(hr = scriptContext->OnDebuggerAttached()))
            {
                Debugger_AttachDetach_unrecoverable_error(hr); // Inconsistent state, we can't continue from here
                return JsErrorFatal;
            }

            // ScriptContext might get closed in OnDebuggerAttached
            if (!scriptContext->IsClosed())
            {
                Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
                probeContainer->InitializeInlineBreakEngine(jsrtDebugManager);
                probeContainer->InitializeDebuggerScriptOptionCallback(jsrtDebugManager);
            }
        }

        return JsNoError;
    });
#endif
}